

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::GenerateBlockSyntax::isChildOptional(size_t index)

{
  return (bool)(0x4aU >> ((byte)index & 0x1f) & index < 7);
}

Assistant:

bool GenerateBlockSyntax::isChildOptional(size_t index) {
    switch (index) {
        case 1: return true;
        case 3: return true;
        case 6: return true;
        default: return false;
    }
}